

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

void __thiscall
pbrt::WeightedReservoirSampler<pbrt::SubsurfaceInteraction>::Add
          (WeightedReservoirSampler<pbrt::SubsurfaceInteraction> *this,SubsurfaceInteraction *sample
          ,Float weight)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Interval IVar4;
  Interval IVar5;
  Interval IVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  fVar1 = weight + this->weightSum;
  this->weightSum = fVar1;
  fVar23 = RNG::Uniform<float>(&this->rng);
  if (fVar23 < weight / fVar1) {
    fVar1 = (sample->ns).super_Tuple3<pbrt::Normal3,_float>.y;
    fVar23 = (sample->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    fVar9 = (sample->dpdu).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar10 = (sample->dpdu).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar2 = *(undefined8 *)&(sample->dpdu).super_Tuple3<pbrt::Vector3,_float>.z;
    fVar11 = (sample->dpdv).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar12 = (sample->dpdv).super_Tuple3<pbrt::Vector3,_float>.z;
    fVar13 = (sample->dpdus).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar14 = (sample->dpdus).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar3 = *(undefined8 *)&(sample->dpdus).super_Tuple3<pbrt::Vector3,_float>.z;
    fVar15 = (sample->dpdvs).super_Tuple3<pbrt::Vector3,_float>.y;
    fVar16 = (sample->dpdvs).super_Tuple3<pbrt::Vector3,_float>.z;
    IVar4 = (sample->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
    IVar5 = (sample->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
    IVar6 = (sample->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
    fVar17 = (sample->n).super_Tuple3<pbrt::Normal3,_float>.x;
    fVar18 = (sample->n).super_Tuple3<pbrt::Normal3,_float>.y;
    uVar7 = *(undefined8 *)&(sample->n).super_Tuple3<pbrt::Normal3,_float>.z;
    fVar19 = (sample->ns).super_Tuple3<pbrt::Normal3,_float>.y;
    fVar20 = (sample->ns).super_Tuple3<pbrt::Normal3,_float>.z;
    fVar21 = (sample->dpdu).super_Tuple3<pbrt::Vector3,_float>.x;
    fVar22 = (sample->dpdu).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar8 = *(undefined8 *)&(sample->dpdu).super_Tuple3<pbrt::Vector3,_float>.z;
    *(undefined8 *)&(this->reservoir).n.super_Tuple3<pbrt::Normal3,_float>.z =
         *(undefined8 *)&(sample->n).super_Tuple3<pbrt::Normal3,_float>.z;
    (this->reservoir).ns.super_Tuple3<pbrt::Normal3,_float>.y = fVar1;
    (this->reservoir).ns.super_Tuple3<pbrt::Normal3,_float>.z = fVar23;
    (this->reservoir).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = fVar9;
    (this->reservoir).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = fVar10;
    *(undefined8 *)&(this->reservoir).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = uVar2;
    (this->reservoir).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = fVar11;
    (this->reservoir).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = fVar12;
    (this->reservoir).dpdus.super_Tuple3<pbrt::Vector3,_float>.x = fVar13;
    (this->reservoir).dpdus.super_Tuple3<pbrt::Vector3,_float>.y = fVar14;
    *(undefined8 *)&(this->reservoir).dpdus.super_Tuple3<pbrt::Vector3,_float>.z = uVar3;
    (this->reservoir).dpdvs.super_Tuple3<pbrt::Vector3,_float>.y = fVar15;
    (this->reservoir).dpdvs.super_Tuple3<pbrt::Vector3,_float>.z = fVar16;
    (this->reservoir).pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
         IVar4;
    (this->reservoir).pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
         IVar5;
    (this->reservoir).pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
         IVar6;
    (this->reservoir).n.super_Tuple3<pbrt::Normal3,_float>.x = fVar17;
    (this->reservoir).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar18;
    *(undefined8 *)&(this->reservoir).n.super_Tuple3<pbrt::Normal3,_float>.z = uVar7;
    (this->reservoir).ns.super_Tuple3<pbrt::Normal3,_float>.y = fVar19;
    (this->reservoir).ns.super_Tuple3<pbrt::Normal3,_float>.z = fVar20;
    (this->reservoir).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = fVar21;
    (this->reservoir).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = fVar22;
    *(undefined8 *)&(this->reservoir).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = uVar8;
    this->reservoirWeight = weight;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    void Add(const T &sample, Float weight) {
        weightSum += weight;
        // Randomly add _sample_ to reservoir
        Float p = weight / weightSum;
        if (rng.Uniform<Float>() < p) {
            reservoir = sample;
            reservoirWeight = weight;
        }

        DCHECK_LT(weightSum, 1e80);
    }